

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  EnumValueDescriptor *value;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  size_type *psVar4;
  undefined7 in_register_00000011;
  long lVar5;
  long lVar6;
  string fullname;
  string filename;
  Printer printer;
  string local_170;
  ZeroCopyOutputStream *local_150;
  string local_148;
  EnumDescriptor *local_128;
  long local_120;
  string local_118;
  string local_f8;
  string local_d8;
  Printer local_b8;
  
  GeneratedEnumFileName_abi_cxx11_
            (&local_d8,(php *)en,(EnumDescriptor *)CONCAT71(in_register_00000011,is_descriptor),
             SUB81(generator_context,0));
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_d8);
  local_150 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&local_b8,local_150,'^');
  io::Printer::Print(&local_b8,
                     "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
                     ,"filename",*(string **)file);
  FilenameToClassname(&local_148,&local_d8);
  iVar2 = std::__cxx11::string::find_last_of((char *)&local_148,0x354046,0xffffffffffffffff);
  if (*(long *)(*(long *)(file + 8) + 8) != 0) {
    std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_148);
    io::Printer::Print(&local_b8,"namespace ^name^;\n\n","name",&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  GenerateEnumDocComment(&local_b8,en);
  if (iVar2 == -1) {
    io::Printer::Print(&local_b8,"class ^name^\n{\n","name",&local_148);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_148);
    io::Printer::Print(&local_b8,"class ^name^\n{\n","name",&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  io::Printer::Indent(&local_b8);
  io::Printer::Indent(&local_b8);
  if (0 < *(int *)(en + 0x2c)) {
    lVar5 = 0;
    lVar6 = 0;
    local_128 = en;
    do {
      lVar1 = *(long *)(en + 0x30);
      value = (EnumValueDescriptor *)(lVar1 + lVar5);
      local_120 = lVar6;
      GenerateEnumValueDocComment(&local_b8,value);
      ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_f8,*(string **)value,en);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,**(ulong **)value);
      psVar4 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_170.field_2._M_allocated_capacity = *psVar4;
        local_170.field_2._8_8_ = plVar3[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar4;
        local_170._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_170._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      IntToString_abi_cxx11_
                (&local_118,(php *)(ulong)*(uint *)(lVar1 + 0x10 + lVar5),
                 (int32)local_170._M_string_length);
      io::Printer::Print(&local_b8,"const ^name^ = ^number^;\n","name",&local_170,"number",
                         &local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      lVar6 = local_120;
      en = local_128;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x28;
    } while (lVar6 < *(int *)(en + 0x2c));
  }
  io::Printer::Outdent(&local_b8);
  io::Printer::Outdent(&local_b8);
  io::Printer::Print(&local_b8,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  io::Printer::~Printer(&local_b8);
  if (local_150 != (ZeroCopyOutputStream *)0x0) {
    (*local_150->_vptr_ZeroCopyOutputStream[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedEnumFileName(en, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateEnumDocComment(&printer, en);

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ClassNamePrefix(value->name(), en) + value->name(),
                  "number", IntToString(value->number()));
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}